

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ExprIterate2(Fts3Expr *pExpr,int *piPhrase,_func_int_Fts3Expr_ptr_int_void_ptr *x,void *pCtx
                    )

{
  int iVar1;
  int iVar2;
  
  iVar2 = pExpr->eType;
  while( true ) {
    if (iVar2 == 5) {
      iVar2 = (*x)(pExpr,*piPhrase,pCtx);
      *piPhrase = *piPhrase + 1;
      return iVar2;
    }
    iVar1 = fts3ExprIterate2(pExpr->pLeft,piPhrase,x,pCtx);
    if (iVar2 == 2) break;
    if (iVar1 != 0) {
      return iVar1;
    }
    pExpr = pExpr->pRight;
    iVar2 = pExpr->eType;
  }
  return iVar1;
}

Assistant:

static int fts3ExprIterate2(
  Fts3Expr *pExpr,                /* Expression to iterate phrases of */
  int *piPhrase,                  /* Pointer to phrase counter */
  int (*x)(Fts3Expr*,int,void*),  /* Callback function to invoke for phrases */
  void *pCtx                      /* Second argument to pass to callback */
){
  int rc;                         /* Return code */
  int eType = pExpr->eType;       /* Type of expression node pExpr */

  if( eType!=FTSQUERY_PHRASE ){
    assert( pExpr->pLeft && pExpr->pRight );
    rc = fts3ExprIterate2(pExpr->pLeft, piPhrase, x, pCtx);
    if( rc==SQLITE_OK && eType!=FTSQUERY_NOT ){
      rc = fts3ExprIterate2(pExpr->pRight, piPhrase, x, pCtx);
    }
  }else{
    rc = x(pExpr, *piPhrase, pCtx);
    (*piPhrase)++;
  }
  return rc;
}